

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.hpp
# Opt level: O3

void __thiscall
duckdb::RegexLocalState::RegexLocalState
          (RegexLocalState *this,RegexpBaseBindData *info,bool extract_all)

{
  int val;
  unsigned_long uVar1;
  Allocator *this_00;
  StringPiece *pSVar2;
  InvalidInputException *this_01;
  StringPiece local_38;
  
  (this->super_FunctionLocalState)._vptr_FunctionLocalState =
       (_func_int **)&PTR__RegexLocalState_02452298;
  local_38.data_ = (info->constant_string)._M_dataplus._M_p;
  local_38.size_ = (info->constant_string)._M_string_length;
  duckdb_re2::RE2::RE2(&this->constant_pattern,&local_38,&info->options);
  (this->group_buffer).size = 0;
  (this->group_buffer).capacity = 0;
  (this->group_buffer).group_buffer = (StringPiece *)0x0;
  if ((*(uint *)&(this->constant_pattern).field_0x44 & 0x1fffffff) == 0) {
    if ((extract_all) && (val = (this->constant_pattern).num_captures_, val != -1)) {
      uVar1 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
      (this->group_buffer).size = uVar1;
      (this->group_buffer).capacity = uVar1 + 1;
      this_00 = Allocator::DefaultAllocator();
      pSVar2 = (StringPiece *)Allocator::AllocateData(this_00,(uVar1 + 1) * 0x10);
      (this->group_buffer).group_buffer = pSVar2;
    }
    return;
  }
  this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this_01,(this->constant_pattern).error_);
  __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

explicit RegexLocalState(RegexpBaseBindData &info, bool extract_all = false)
	    : constant_pattern(duckdb_re2::StringPiece(info.constant_string.c_str(), info.constant_string.size()),
	                       info.options) {
		if (!constant_pattern.ok()) {
			throw InvalidInputException(constant_pattern.error());
		}
		if (extract_all) {
			auto group_count_p = constant_pattern.NumberOfCapturingGroups();
			if (group_count_p != -1) {
				group_buffer.Init(NumericCast<idx_t>(group_count_p));
			}
		}
		D_ASSERT(info.constant_pattern);
	}